

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::Aborted::send
          (Aborted *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined4 in_register_00000034;
  String local_1d0;
  Exception local_1b8;
  undefined8 local_28;
  Aborted *this_local;
  ArrayPtr<const_unsigned_char> message_local;
  
  local_28 = CONCAT44(in_register_00000034,__fd);
  this_local = (Aborted *)__buf;
  message_local.ptr = (uchar *)__n;
  message_local.size_ = (size_t)this;
  kj::_::Debug::makeDescription<char_const(&)[41]>
            (&local_1d0,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",(char (*) [41])__n);
  Exception::Exception
            (&local_1b8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1139,&local_1d0);
  Promise<void>::Promise((Promise<void> *)this,&local_1b8);
  Exception::~Exception(&local_1b8);
  String::~String(&local_1d0);
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> send(kj::ArrayPtr<const byte> message) override {
      return KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed");
    }